

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defaultShaders.cpp
# Opt level: O2

string * __thiscall
vera::getDefaultSrc_abi_cxx11_(string *__return_storage_ptr__,vera *this,DefaultShaders _type)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)versionLine_abi_cxx11_);
  switch((ulong)this & 0xffffffff) {
  case 0:
    break;
  case 1:
    break;
  case 2:
    break;
  case 3:
    break;
  case 4:
    std::operator+(&bStack_78,&default_scene_frag0_abi_cxx11_,&default_scene_frag1_abi_cxx11_);
    std::operator+(&local_58,&bStack_78,&default_scene_frag2_abi_cxx11_);
    std::operator+(&local_38,&local_58,&default_scene_frag3_abi_cxx11_);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&bStack_78);
    return __return_storage_ptr__;
  case 5:
    break;
  case 6:
    break;
  case 7:
    break;
  case 8:
    break;
  case 9:
    break;
  case 10:
    break;
  case 0xb:
    break;
  case 0xc:
    break;
  case 0xd:
    break;
  case 0xe:
    break;
  case 0xf:
    break;
  case 0x10:
    break;
  case 0x11:
    break;
  case 0x12:
    break;
  case 0x13:
    break;
  case 0x14:
    break;
  case 0x15:
    break;
  case 0x16:
    break;
  case 0x17:
    break;
  case 0x18:
    break;
  case 0x19:
    break;
  default:
    goto switchD_002529c0_default;
  }
  std::__cxx11::string::append((string *)__return_storage_ptr__);
switchD_002529c0_default:
  return __return_storage_ptr__;
}

Assistant:

std::string getDefaultSrc( DefaultShaders _type ) {
    std::string rta = versionLine;

    if (_type == VERT_DEFAULT) {
        if (versionNumber < 130)
            rta += default_vert;
        else if (versionNumber >= 130) 
            rta += default_vert_300;
    }
    else if (_type == FRAG_DEFAULT) {
        rta += default_frag;
    }
    else if (_type == FRAG_DEFAULT_TEXTURE) {
        rta += default_texture_frag;
    }
    else if (_type == VERT_DEFAULT_SCENE) {
        if (versionNumber < 130)
            rta += default_scene_vert;
        else if (versionNumber >= 130) 
            rta += default_scene_vert_300;
    }
    else if (_type == FRAG_DEFAULT_SCENE) {
        rta += default_scene_frag0 + default_scene_frag1 + default_scene_frag2 + default_scene_frag3;
    }
    else if (_type == VERT_BILLBOARD) {
        if (versionNumber < 130)
            rta += billboard_vert;
        else if (versionNumber >= 130) 
            rta += billboard_vert_300;
    }
    else if (_type == VERT_DYNAMIC_BILLBOARD) {
        if (versionNumber < 130)
            rta += dynamic_billboard_vert;
        else if (versionNumber >= 130) 
            rta += dynamic_billboard_vert_300;
    }
    else if (_type == FRAG_DYNAMIC_BILLBOARD) {
        if (versionNumber < 130)
            rta += dynamic_billboard_frag;
        else if (versionNumber >= 130) 
            rta += dynamic_billboard_frag_300;
    }
    else if (_type == VERT_CUBEMAP) {
        if (versionNumber < 130)
            rta += cube_vert;
        else if (versionNumber >= 130) 
            rta += cube_vert_300;
    }
    else if (_type == FRAG_CUBEMAP) {
        if (versionNumber < 130)
            rta += cube_frag;
        else if (versionNumber >= 130) 
            rta += cube_frag_300;
    }
    else if (_type == VERT_ERROR) {
        if (versionNumber < 130)
            rta += error_vert;
        else if (versionNumber >= 130) 
            rta += error_vert_300;
    }
    else if (_type == FRAG_ERROR) {
        if (versionNumber < 130)
            rta += error_frag;
        else if (versionNumber >= 130) 
            rta += error_frag_300;
    }
    else if (_type == VERT_LIGHT) {
        if (versionNumber < 130)
            rta += light_vert;
        else if (versionNumber >= 130) 
            rta += light_vert_300;
    }
    else if (_type == FRAG_LIGHT) {
        if (versionNumber < 130)
            rta += light_frag;
        else if (versionNumber >= 130) 
            rta += light_frag_300;
    }

    else if (_type == VERT_FILL) {
        if (versionNumber < 130)
            rta += fill_vert;
        else if (versionNumber >= 130) 
            rta += fill_vert_300;
    }
    else if (_type == FRAG_FILL) {
        if (versionNumber < 130)
            rta += fill_frag;
        else if (versionNumber >= 130) 
            rta += fill_frag_300;
    }

    else if (_type == VERT_POINTS) {
        if (versionNumber < 130)
            rta += points_vert;
        else if (versionNumber >= 130) 
            rta += points_vert_300;
    }
    else if (_type == FRAG_POINTS) {
        if (versionNumber < 130)
            rta += points_frag;
        else if (versionNumber >= 130) 
            rta += points_frag_300;
    }

    else if (_type == FRAG_POSITION) {
        if (versionNumber < 130)
            rta += default_buffer_position;
        else if (versionNumber >= 130) 
            rta += default_buffer_position_300;
    }
    else if (_type == FRAG_NORMAL) {
        if (versionNumber < 130)
            rta += default_buffer_normal;
        else if (versionNumber >= 130) 
            rta += default_buffer_normal_300;
    }

    else if (_type == FRAG_PLOT) {
        if (versionNumber < 130)
            rta += plot_frag;
        else if (versionNumber >= 130) 
            rta += plot_frag_300;
    }
    else if (_type == FRAG_FXAA) {
        if (versionNumber < 130)
            rta += fxaa_frag;
        else if (versionNumber >= 130) 
            rta += fxaa_frag_300;
    }
    else if (_type == FRAG_POISSONFILL) {
        if (versionNumber < 130)
            rta += poissonfill_frag;
        else if (versionNumber >= 130) 
            rta += poissonfill_frag_300;
    } 
    else if (_type == FRAG_JUMPFLOOD) {
        if (versionNumber < 130)
            rta += jumpflood_frag;
        else if (versionNumber >= 130) 
            rta += jumpflood_frag_300;
    }
    else if (_type == VERT_DEVLOOK_BILLBOARD) {
        if (versionNumber < 130)
            rta += devlook_billboard_vert;
        else if (versionNumber >= 130) 
            rta += devlook_billboard_vert_300;
    }
    else if (_type == VERT_DEVLOOK_SPHERE) {
        if (versionNumber < 130)
            rta += devlook_sphere_vert;
        else if (versionNumber >= 130) 
            rta += devlook_sphere_vert_300;
    }

    return rta;
}